

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

KeyData * __thiscall
cfd::core::KeyData::DerivePrivkey
          (KeyData *__return_storage_ptr__,KeyData *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *path,bool has_rebase_path)

{
  Privkey *this_00;
  bool bVar1;
  CfdException *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> join_path;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  ByteData fp;
  ExtPrivkey key;
  
  this_00 = &(this->extprivkey_).privkey_;
  bVar1 = Privkey::IsValid(this_00);
  if (bVar1) {
    ExtPrivkey::DerivePrivkey(&key,&this->extprivkey_,path);
    if (has_rebase_path) {
      Privkey::Privkey((Privkey *)&join_path,this_00);
      Privkey::GeneratePubkey((Pubkey *)&local_d0,(Privkey *)&join_path,true);
      Pubkey::GetFingerprint(&fp,(Pubkey *)&local_d0,4);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&join_path);
      KeyData(__return_storage_ptr__,&key,path,&fp);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&fp);
    }
    else {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&join_path,&this->path_);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                (&join_path,
                 ((long)(path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 2) +
                 ((long)join_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)join_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2));
      ::std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_int*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish,&join_path);
      KeyData(__return_storage_ptr__,&key,&join_path,&this->fingerprint_);
      ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&join_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    ExtPrivkey::~ExtPrivkey(&key);
    return __return_storage_ptr__;
  }
  key.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = "cfdcore_hdwallet.cpp";
  key.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x51c;
  key.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = "DerivePrivkey";
  logger::warn<>((CfdSourceLocation *)&key,"Failed to invalid extPrivkey.");
  this_01 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&key,"Failed to invalid extPrivkey.",(allocator *)&join_path);
  CfdException::CfdException(this_01,kCfdIllegalStateError,(string *)&key);
  __cxa_throw(this_01,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

KeyData KeyData::DerivePrivkey(
    std::vector<uint32_t> path, bool has_rebase_path) const {
  if (!extprivkey_.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to invalid extPrivkey.");
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Failed to invalid extPrivkey.");
  }
  ExtPrivkey key = extprivkey_.DerivePrivkey(path);
  if (has_rebase_path) {
    auto fp = extprivkey_.GetPrivkey().GeneratePubkey().GetFingerprint();
    return KeyData(key, path, fp);
  } else {
    auto join_path = path_;
    join_path.reserve(join_path.size() + path.size());
    std::copy(path.begin(), path.end(), std::back_inserter(join_path));
    return KeyData(key, join_path, fingerprint_);
  }
}